

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O1

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
__thiscall
Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>::
operator()(EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize> *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *poly,PolyNf *evaluatedArgs)

{
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *extraout_RDX;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  PVar1;
  uint offs;
  uint local_94;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_90;
  PolyNf *local_70;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_68;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:238:23),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_48;
  
  local_48._iter._func.evaluatedArgs = &local_70;
  local_48._iter._func.offs = &local_94;
  local_94 = 0;
  local_48._iter._inner._func.a =
       *(Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> **)
        ((evaluatedArgs->super_PolyNfSuper)._inner.
         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
         .
         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
         ._content + 7);
  local_48._iter._inner._inner._to =
       ((long)(local_48._iter._inner._func.a)->_cursor -
        (long)(local_48._iter._inner._func.a)->_stack >> 4) * -0x5555555555555555;
  local_48._iter._inner._inner._next = 0;
  local_48._iter._inner._inner._from = 0;
  local_48._iter._func.this =
       (EvaluateMonom<Inferences::NumeralMultiplicationGeneralizationImpl::Generalize> *)poly;
  ::Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:238:23),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(&local_68,&local_48);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_90,&local_68);
  ::Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)this,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_90);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_90);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_68);
  PVar1._ptr = extraout_RDX;
  PVar1._0_8_ = this;
  return PVar1;
}

Assistant:

Perfect<Polynom<NumTraits>> operator()(Perfect<Polynom<NumTraits>> poly, PolyNf* evaluatedArgs)
  { 
    using Polynom   = Kernel::Polynom<NumTraits>;
    using Monom  = Kernel::Monom<NumTraits>;

    unsigned offs = 0;
    return perfect(Polynom(
                poly->iterSummands()
                 .map([&](Monom m) -> Monom { 
                   auto result = eval(m, &evaluatedArgs[offs]);
                   offs += m.factors->nFactors();
                   return result;
               })
            .template collect<Stack>()));
  }